

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ising_model.cc
# Opt level: O0

void __thiscall lattice::resize(lattice *this,int newL)

{
  int in_ESI;
  long in_RDI;
  undefined4 in_stack_00000008;
  
  if (0 < in_ESI) {
    *(int *)(in_RDI + 0x18) = in_ESI;
    *(int *)(in_RDI + 0x1c) = *(int *)(in_RDI + 0x18) * *(int *)(in_RDI + 0x18);
    std::vector<int,_std::allocator<int>_>::resize(&this->s,CONCAT44(newL,in_stack_00000008));
    return;
  }
  std::operator<<((ostream *)&std::cerr,"negative size\n");
  exit(1);
}

Assistant:

void lattice::resize(int newL) {
  if (newL > 0) {
    L = newL;
    L2 = L * L;
    s.resize(L2);
  } else {
    std::cerr << "negative size\n";
    std::exit(EXIT_FAILURE);
  }
}